

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O2

type_conflict2
jsoncons::detail::from_integer<long,jsoncons::stream_sink<char>>
          (long value,stream_sink<char> *result)

{
  bool bVar1;
  assertion_error *this;
  ulong uVar2;
  long lVar3;
  type_conflict2 tVar4;
  type_conflict2 tVar5;
  ulong uVar6;
  char *pcVar7;
  allocator<char> local_149;
  string local_148;
  char_type buf [255];
  
  lVar3 = value;
  uVar2 = value;
  uVar6 = 0;
  if (value < 0) {
    do {
      buf[uVar6] = '0' - (char)(lVar3 % 10);
      tVar5 = uVar6 + 1;
      if (0xfd < uVar6) break;
      uVar2 = lVar3 - 10;
      lVar3 = lVar3 / 10;
      uVar6 = tVar5;
    } while (uVar2 < 0xffffffffffffffed);
  }
  else {
    do {
      buf[uVar6] = (byte)(uVar2 % 10) | 0x30;
      tVar5 = uVar6 + 1;
      if (0xfd < uVar6) break;
      bVar1 = 9 < uVar2;
      uVar2 = uVar2 / 10;
      uVar6 = tVar5;
    } while (bVar1);
  }
  if (tVar5 == 0xff) {
    this = (assertion_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"assertion \'p != last\' failed at  <> :0",&local_149);
    assertion_error::assertion_error(this,&local_148);
    __cxa_throw(this,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tVar4 = tVar5;
  if (value < 0) {
    stream_sink<char>::push_back(result,'-');
    tVar4 = tVar5 + 1;
  }
  pcVar7 = buf + tVar5;
  while (pcVar7 = pcVar7 + -1, buf <= pcVar7) {
    stream_sink<char>::push_back(result,*pcVar7);
  }
  return tVar4;
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    from_integer(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = static_cast<char_type>(48 - (value % 10));
            }
            while ((value /= 10) && (p < last));
        }
        else
        {

            do
            {
                *p++ = static_cast<char_type>(48 + value % 10);
            }
            while ((value /= 10) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }